

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O3

char * get_yanglint_dir(void)

{
  char *__s;
  __uid_t __uid;
  int iVar1;
  passwd *ppVar2;
  size_t sVar3;
  char *__s_00;
  int *piVar4;
  
  __uid = getuid();
  ppVar2 = getpwuid(__uid);
  if (ppVar2 == (passwd *)0x0) {
    get_yanglint_dir_cold_4();
  }
  else {
    __s = ppVar2->pw_dir;
    sVar3 = strlen(__s);
    __s_00 = (char *)malloc(sVar3 + 0xb);
    if (__s_00 == (char *)0x0) {
      get_yanglint_dir_cold_3();
    }
    else {
      sprintf(__s_00,"%s/%s",__s,".yanglint");
      iVar1 = access(__s_00,5);
      if (iVar1 != -1) {
        return __s_00;
      }
      piVar4 = __errno_location();
      if (*piVar4 == 2) {
        fprintf(_stdout,"Configuration directory \"%s\" does not exist, creating it.\n",__s_00);
        iVar1 = mkdir(__s_00,0x1c0);
        if (iVar1 == 0) {
          return __s_00;
        }
        get_yanglint_dir_cold_2();
      }
      else {
        get_yanglint_dir_cold_1();
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
get_yanglint_dir(void)
{
    int ret;
    struct passwd *pw;
    char *user_home, *yl_dir;

    if (!(pw = getpwuid(getuid()))) {
        fprintf(stderr, "Determining home directory failed (%s).\n", strerror(errno));
        return NULL;
    }
    user_home = pw->pw_dir;

    yl_dir = malloc(strlen(user_home) + 1 + strlen(YL_DIR) + 1);
    if (!yl_dir) {
        fprintf(stderr, "Memory allocation failed (%s).\n", strerror(errno));
        return NULL;
    }
    sprintf(yl_dir, "%s/%s", user_home, YL_DIR);

    ret = access(yl_dir, R_OK | X_OK);
    if (ret == -1) {
        if (errno == ENOENT) {
            /* directory does not exist */
            fprintf(stdout, "Configuration directory \"%s\" does not exist, creating it.\n", yl_dir);
            if (mkdir(yl_dir, 00700)) {
                fprintf(stderr, "Configuration directory \"%s\" cannot be created (%s).\n", yl_dir, strerror(errno));
                free(yl_dir);
                return NULL;
            }
        } else {
            fprintf(stderr, "Configuration directory \"%s\" exists but cannot be accessed (%s).\n", yl_dir, strerror(errno));
            free(yl_dir);
            return NULL;
        }
    }

    return yl_dir;
}